

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O1

void mstl(double *x,int N,int *f,int *Nseas,int *s_window,double *lambda,int *iterate,
         double **seasonal,double *trend,double *remainder)

{
  size_t __size;
  double *pdVar1;
  void *pvVar2;
  int iVar3;
  size_t __nmemb;
  double *y;
  int *pos;
  double *x_00;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int N_00;
  ulong uVar11;
  int local_58;
  int local_54;
  int s_window_;
  void *local_48;
  double *local_40;
  int local_38;
  uint local_34;
  
  if (s_window == (int *)0x0) {
    local_58 = 0xd;
  }
  else {
    local_58 = *s_window;
  }
  if (iterate == (int *)0x0) {
    local_38 = 2;
  }
  else {
    local_38 = *iterate;
  }
  __nmemb = (size_t)N;
  __size = __nmemb * 8;
  _s_window_ = Nseas;
  y = (double *)malloc(__size);
  local_34 = N;
  if (lambda == (double *)0x0) {
    memcpy(y,x,__size);
  }
  else {
    boxcox(x,N,lambda,y);
  }
  lVar7 = (long)*_s_window_;
  local_40 = (double *)malloc(lVar7 * 8);
  if (lVar7 < 1) {
    uVar10 = 0;
  }
  else {
    lVar5 = 0;
    uVar10 = 0;
    do {
      if (f[lVar5] < (int)local_34 / 2) {
        local_40[(int)uVar10] = (double)f[lVar5];
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      lVar5 = lVar5 + 1;
    } while (lVar7 != lVar5);
  }
  N_00 = (int)uVar10;
  pos = (int *)malloc((long)N_00 * 4);
  sort1d_ascending(local_40,N_00,pos);
  uVar9 = local_34;
  if (N_00 < 1) {
    x_00 = (double *)malloc(__size);
    uVar9 = local_34;
    uVar10 = (ulong)local_34;
    if (0 < (int)local_34) {
      uVar6 = 0;
      do {
        x_00[uVar6] = (double)(int)uVar6;
        uVar6 = uVar6 + 1;
      } while (uVar10 != uVar6);
    }
    supsmu(x_00,local_34,y,(double *)0x0,1,0.0,-1.0,trend);
    if (0 < (int)uVar9) {
      uVar6 = 0;
      do {
        remainder[uVar6] = y[uVar6] - trend[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar10 != uVar6);
    }
    *_s_window_ = 0;
  }
  else {
    local_48 = calloc((long)(int)(N_00 * local_34),8);
    x_00 = (double *)calloc(__nmemb,8);
    memcpy(x_00,y,__size);
    uVar8 = uVar9;
    if (0 < local_38) {
      iVar3 = 0;
      do {
        uVar6 = 0;
        uVar11 = 0;
        do {
          pvVar2 = local_48;
          if (0 < (int)uVar8) {
            uVar4 = 0;
            do {
              x_00[uVar4] = *(double *)((long)local_48 + uVar4 * 8 + uVar6 * 8) + x_00[uVar4];
              uVar4 = uVar4 + 1;
            } while (uVar9 != uVar4);
          }
          local_54 = (int)local_40[uVar11];
          stl(x_00,uVar8,local_54,"null",&local_58,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,
              (int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,
              (double *)((long)local_48 + uVar11 * __nmemb * 8),trend,remainder);
          if (0 < (int)local_34) {
            uVar4 = 0;
            do {
              x_00[uVar4] = x_00[uVar4] - *(double *)((long)pvVar2 + uVar4 * 8 + uVar6 * 8);
              uVar4 = uVar4 + 1;
            } while (uVar9 != uVar4);
          }
          f[uVar11] = local_54;
          uVar11 = uVar11 + 1;
          uVar6 = (ulong)((int)uVar6 + local_34);
          uVar8 = local_34;
        } while (uVar11 != uVar10);
        iVar3 = iVar3 + 1;
      } while (iVar3 != local_38);
    }
    if (0 < (int)uVar8) {
      uVar6 = 0;
      do {
        remainder[uVar6] = x_00[uVar6] - trend[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    uVar6 = 1;
    if (1 < N_00) {
      uVar6 = uVar10;
    }
    uVar11 = 0;
    uVar10 = 0;
    uVar9 = uVar8;
    do {
      if (0 < (int)uVar9) {
        pdVar1 = seasonal[uVar10];
        uVar4 = 0;
        do {
          pdVar1[uVar4] = *(double *)((long)local_48 + uVar4 * 8 + uVar11 * 8);
          uVar4 = uVar4 + 1;
        } while (uVar8 != uVar4);
      }
      uVar10 = uVar10 + 1;
      uVar11 = (ulong)((int)uVar11 + local_34);
      uVar9 = local_34;
    } while (uVar10 != uVar6);
    *_s_window_ = N_00;
    free(local_48);
  }
  free(x_00);
  free(y);
  free(pos);
  free(local_40);
  return;
}

Assistant:

void mstl(double *x, int N, int *f, int *Nseas, int *s_window,double *lambda,int *iterate, double **seasonal, double *trend,double *remainder) {
    int i,j,k,s_window_,Niter,iterate_,iter,freq;
    double *y,*t,*deseas;
    double *msts,*seas;
    int *pos;

    Niter = 0;

    s_window_ = (s_window == NULL) ? 13 : *s_window;
    iterate_ = (iterate == NULL) ? 2 : *iterate;

    y = (double*)malloc(sizeof(double)*N);

    if (lambda != NULL) {
        boxcox(x,N,lambda,y);
    } else {
        memcpy(y,x,sizeof(double)*N);
    }

    msts = (double*)malloc(sizeof(double)*(*Nseas));

    for(i = 0; i < *Nseas;++i) {
        if (f[i] < N / 2) {
            msts[Niter] = (double) f[i];
            Niter++;
        }
    }

    pos = (int*)malloc(sizeof(int)*Niter);

    sort1d_ascending(msts,Niter,pos);

    if (Niter > 0) {

        seas = (double*)calloc(Niter*N,sizeof(double));
        deseas = (double*)calloc(N,sizeof(double));

        memcpy(deseas,y,sizeof(double)*N);

        for(j = 0; j < iterate_;++j) {
            for(i = 0; i < Niter;++i) {
                iter = i * N;
                for(k = 0; k < N;++k) {
                    deseas[k] += seas[iter+k];
                }
                freq = (int) msts[i];
                stl(deseas,N,freq,"null",&s_window_,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,seas+iter,trend,remainder);
                for(k = 0; k < N;++k) {
                    deseas[k] -= seas[iter+k];
                }
                f[i] = freq;
            }
        }

        for(i = 0; i < N;++i) {
            remainder[i] = deseas[i] - trend[i];
        }
        for(i = 0; i < Niter;++i) {
            iter = i * N;
            for(j = 0; j < N;++j) {
                seasonal[i][j] = seas[iter+j];
            }
        }

        *Nseas = Niter;

        free(seas);
        free(deseas);
    } else {
        t = (double*) malloc(sizeof(double)*N);
        for(i = 0; i < N;++i) {
            t[i] = i;
        }
        supsmu(t,N,y,NULL,1,0,-1.0,trend);
        for(i = 0; i < N;++i) {
            remainder[i] = y[i] - trend[i];
        }
        *Nseas = 0;
        free(t);
    }


    free(y);
    free(pos);
    free(msts);
}